

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Set_block_cyclic(int g_a,int *dims)

{
  Integer IVar1;
  Integer *pIVar2;
  long lVar3;
  long lVar4;
  Integer _ga_dims [7];
  Integer aIStack_48 [7];
  
  IVar1 = pnga_get_dimension((long)g_a);
  lVar3 = 0;
  lVar4 = 0;
  if (0 < IVar1) {
    lVar4 = IVar1;
  }
  pIVar2 = aIStack_48 + IVar1;
  for (; pIVar2 = pIVar2 + -1, lVar4 != lVar3; lVar3 = lVar3 + 1) {
    *pIVar2 = (long)dims[lVar3];
  }
  pnga_set_block_cyclic((long)g_a,aIStack_48);
  return;
}

Assistant:

void NGA_Set_block_cyclic(int g_a, int dims[])
{
    Integer aa, ndim;
    Integer _ga_dims[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(dims,_ga_dims, ndim);
    wnga_set_block_cyclic(aa, _ga_dims);
}